

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_option
          (App *this,string *option_name,callback_t *option_callback,string *option_description,
          bool defaulted,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *func)

{
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar1;
  App *pAVar2;
  pointer puVar3;
  pointer pbVar4;
  bool bVar5;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var6;
  Option *pOVar7;
  string *psVar8;
  pointer puVar9;
  OptionAlreadyAdded *pOVar10;
  pointer pbVar11;
  char cVar12;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  __uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *this_00;
  string test_name;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_4c0;
  string local_4a0;
  string local_480;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_460;
  string local_440;
  string local_420;
  string local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  Option myopt;
  
  ::std::__cxx11::string::string((string *)&local_420,(string *)option_name);
  ::std::__cxx11::string::string((string *)&local_440,(string *)option_description);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&local_460,option_callback);
  Option::Option(&myopt,&local_420,&local_440,&local_460,this,this->allow_non_standard_options_);
  std::_Function_base::~_Function_base(&local_460.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_440);
  ::std::__cxx11::string::~string((string *)&local_420);
  _Var6 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>,std::__cxx11::string,bool,std::function<std::__cxx11::string()>)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&myopt);
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var6._M_current != puVar1) {
    puVar13 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (puVar13 == puVar1) {
        pOVar10 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string
                  ((string *)&local_400,"added option matched existing option name",
                   (allocator *)&test_name);
        OptionAlreadyAdded::OptionAlreadyAdded(pOVar10,&local_400);
        __cxa_throw(pOVar10,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
      psVar8 = Option::matching_name_abi_cxx11_
                         ((puVar13->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&myopt);
      puVar13 = puVar13 + 1;
    } while (psVar8->_M_string_length == 0);
    pOVar10 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
    ::std::operator+(&local_3e0,"added option matched existing option name: ",psVar8);
    OptionAlreadyAdded::OptionAlreadyAdded(pOVar10,&local_3e0);
    __cxa_throw(pOVar10,&OptionAlreadyAdded::typeinfo,Error::~Error);
  }
  if ((myopt.lnames_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       myopt.lnames_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (myopt.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      myopt.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    psVar8 = Option::get_single_name_abi_cxx11_(&myopt);
    ::std::operator+(&test_name,"--",psVar8);
    if (test_name._M_string_length == 3) {
      ::std::__cxx11::string::erase((ulong)&test_name,0);
    }
    ::std::__cxx11::string::string((string *)&local_300,(string *)&test_name);
    pOVar7 = get_option_no_throw(this,&local_300);
    ::std::__cxx11::string::~string((string *)&local_300);
    if ((pOVar7 != (Option *)0x0) && ((pOVar7->super_OptionBase<CLI::Option>).configurable_ == true)
       ) {
      pOVar10 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_340,"added option positional name matches existing option: ",
                       &test_name);
      OptionAlreadyAdded::OptionAlreadyAdded(pOVar10,&local_340);
      __cxa_throw(pOVar10,&OptionAlreadyAdded::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::~string((string *)&test_name);
  }
  else if (this->parent_ != (App *)0x0) {
    for (pbVar11 = myopt.lnames_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = myopt.snames_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        pbVar11 !=
        myopt.lnames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
      pAVar2 = this->parent_;
      ::std::__cxx11::string::string((string *)&local_2a0,(string *)pbVar11);
      pOVar7 = get_option_no_throw(pAVar2,&local_2a0);
      ::std::__cxx11::string::~string((string *)&local_2a0);
      if ((pOVar7 != (Option *)0x0) &&
         ((pOVar7->super_OptionBase<CLI::Option>).configurable_ == true)) {
        pOVar10 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_360,"added option matches existing positional option: ",pbVar11);
        OptionAlreadyAdded::OptionAlreadyAdded(pOVar10,&local_360);
        __cxa_throw(pOVar10,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
    }
    for (pbVar11 = myopt.snames_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar4;
        pbVar11 = pbVar11 + 1) {
      pAVar2 = this->parent_;
      ::std::__cxx11::string::string((string *)&local_2c0,(string *)pbVar11);
      pOVar7 = get_option_no_throw(pAVar2,&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_2c0);
      if ((pOVar7 != (Option *)0x0) &&
         ((pOVar7->super_OptionBase<CLI::Option>).configurable_ == true)) {
        pOVar10 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_380,"added option matches existing positional option: ",pbVar11);
        OptionAlreadyAdded::OptionAlreadyAdded(pOVar10,&local_380);
        __cxa_throw(pOVar10,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
    }
  }
  if (this->allow_non_standard_options_ == true) {
    if (myopt.snames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        myopt.snames_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (pbVar11 = myopt.snames_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; cVar12 = (char)&test_name,
          pbVar11 !=
          myopt.snames_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
        if (1 < pbVar11->_M_string_length) {
          test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
          test_name._M_string_length = 0;
          test_name.field_2._M_local_buf[0] = '\0';
          ::std::__cxx11::string::push_back(cVar12);
          ::std::__cxx11::string::push_back(cVar12);
          ::std::__cxx11::string::string((string *)&local_2e0,(string *)&test_name);
          pOVar7 = get_option_no_throw(this,&local_2e0);
          ::std::__cxx11::string::~string((string *)&local_2e0);
          if (pOVar7 != (Option *)0x0) {
            pOVar10 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
            ::std::operator+(&local_3a0,"added option interferes with existing short option: ",
                             pbVar11);
            OptionAlreadyAdded::OptionAlreadyAdded(pOVar10,&local_3a0);
            __cxa_throw(pOVar10,&OptionAlreadyAdded::typeinfo,Error::~Error);
          }
          ::std::__cxx11::string::~string((string *)&test_name);
        }
      }
      puVar3 = (this->options_).
               super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar9 = (this->options_).
                    super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1
          ) {
        pOVar7 = (puVar9->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        pbVar11 = *(pointer *)
                   ((long)&(pOVar7->snames_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   + 8);
        for (__rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      &(pOVar7->snames_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl; __rhs != pbVar11; __rhs = __rhs + 1) {
          if (1 < __rhs->_M_string_length) {
            test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
            test_name._M_string_length = 0;
            test_name.field_2._M_local_buf[0] = '\0';
            ::std::__cxx11::string::push_back(cVar12);
            ::std::__cxx11::string::string((string *)&local_320,(string *)&test_name);
            bVar5 = Option::check_sname(&myopt,&local_320);
            ::std::__cxx11::string::~string((string *)&local_320);
            if (bVar5) {
              pOVar10 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
              ::std::operator+(&local_3c0,
                               "added option interferes with existing non standard option: ",__rhs);
              OptionAlreadyAdded::OptionAlreadyAdded(pOVar10,&local_3c0);
              __cxa_throw(pOVar10,&OptionAlreadyAdded::typeinfo,Error::~Error);
            }
            ::std::__cxx11::string::~string((string *)&test_name);
          }
        }
      }
    }
  }
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::emplace_back<>(&this->options_);
  puVar9 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pOVar7 = (Option *)operator_new(0x250);
  ::std::__cxx11::string::string((string *)&local_480,(string *)option_name);
  ::std::__cxx11::string::string((string *)&local_4a0,(string *)option_description);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&local_4c0,option_callback);
  Option::Option(pOVar7,&local_480,&local_4a0,&local_4c0,this,this->allow_non_standard_options_);
  this_00 = (__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *)(puVar9 + -1);
  std::__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_00,pOVar7);
  std::_Function_base::~_Function_base(&local_4c0.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_4a0);
  ::std::__cxx11::string::~string((string *)&local_480);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&((this_00->_M_t).
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->default_function_,func);
  if (defaulted) {
    Option::capture_default_str
              ((this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
  }
  OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
            (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
             (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
  pOVar7 = (this_00->_M_t).super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if ((!defaulted) && ((pOVar7->super_OptionBase<CLI::Option>).always_capture_default_ == true)) {
    Option::capture_default_str(pOVar7);
    pOVar7 = (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  Option::~Option(&myopt);
  return pOVar7;
}

Assistant:

CLI11_INLINE Option *App::add_option(std::string option_name,
                                     callback_t option_callback,
                                     std::string option_description,
                                     bool defaulted,
                                     std::function<std::string()> func) {
    Option myopt{option_name, option_description, option_callback, this, allow_non_standard_options_};

    if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) { return *v == myopt; }) ==
       std::end(options_)) {
        if(myopt.lnames_.empty() && myopt.snames_.empty()) {
            // if the option is positional only there is additional potential for ambiguities in config files and needs
            // to be checked
            std::string test_name = "--" + myopt.get_single_name();
            if(test_name.size() == 3) {
                test_name.erase(0, 1);
            }

            auto *op = get_option_no_throw(test_name);
            if(op != nullptr && op->get_configurable()) {
                throw(OptionAlreadyAdded("added option positional name matches existing option: " + test_name));
            }
        } else if(parent_ != nullptr) {
            for(auto &ln : myopt.lnames_) {
                auto *op = parent_->get_option_no_throw(ln);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + ln));
                }
            }
            for(auto &sn : myopt.snames_) {
                auto *op = parent_->get_option_no_throw(sn);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + sn));
                }
            }
        }
        if(allow_non_standard_options_ && !myopt.snames_.empty()) {
            for(auto &sname : myopt.snames_) {
                if(sname.length() > 1) {
                    std::string test_name;
                    test_name.push_back('-');
                    test_name.push_back(sname.front());
                    auto *op = get_option_no_throw(test_name);
                    if(op != nullptr) {
                        throw(OptionAlreadyAdded("added option interferes with existing short option: " + sname));
                    }
                }
            }
            for(auto &opt : options_) {
                for(const auto &osn : opt->snames_) {
                    if(osn.size() > 1) {
                        std::string test_name;
                        test_name.push_back(osn.front());
                        if(myopt.check_sname(test_name)) {
                            throw(OptionAlreadyAdded("added option interferes with existing non standard option: " +
                                                     osn));
                        }
                    }
                }
            }
        }
        options_.emplace_back();
        Option_p &option = options_.back();
        option.reset(new Option(option_name, option_description, option_callback, this, allow_non_standard_options_));

        // Set the default string capture function
        option->default_function(func);

        // For compatibility with CLI11 1.7 and before, capture the default string here
        if(defaulted)
            option->capture_default_str();

        // Transfer defaults to the new option
        option_defaults_.copy_to(option.get());

        // Don't bother to capture if we already did
        if(!defaulted && option->get_always_capture_default())
            option->capture_default_str();

        return option.get();
    }
    // we know something matches now find what it is so we can produce more error information
    for(auto &opt : options_) {
        const auto &matchname = opt->matching_name(myopt);
        if(!matchname.empty()) {
            throw(OptionAlreadyAdded("added option matched existing option name: " + matchname));
        }
    }
    // this line should not be reached the above loop should trigger the throw
    throw(OptionAlreadyAdded("added option matched existing option name"));  // LCOV_EXCL_LINE
}